

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath __thiscall testing::internal::FilePath::RemoveExtension(FilePath *this,char *extension)

{
  bool bVar1;
  size_t extraout_RDX;
  FilePath FVar2;
  String dot_extension;
  String SStack_38;
  String local_28;
  
  String::Format((char *)&local_28,".%s");
  bVar1 = String::EndsWithCaseInsensitive((String *)extension,local_28.c_str_);
  if (bVar1) {
    String::ConstructNonNull(&SStack_38,*(char **)extension,*(long *)(extension + 8) - 4);
    FilePath(this,&SStack_38);
    String::~String(&SStack_38);
  }
  else {
    String::String(&this->pathname_,(String *)extension);
  }
  String::~String(&local_28);
  FVar2.pathname_.length_ = extraout_RDX;
  FVar2.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar2.pathname_;
}

Assistant:

FilePath FilePath::RemoveExtension(const char* extension) const {
  String dot_extension(String::Format(".%s", extension));
  if (pathname_.EndsWithCaseInsensitive(dot_extension.c_str())) {
    return FilePath(String(pathname_.c_str(), pathname_.length() - 4));
  }
  return *this;
}